

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void cellUnion(Rtree *pRtree,RtreeCell *p1,RtreeCell *p2)

{
  ulong uVar1;
  int iVar2;
  float fVar3;
  
  if (pRtree->eCoordType == '\0') {
    uVar1 = 0;
    do {
      fVar3 = p1->aCoord[uVar1].f;
      if (p2->aCoord[uVar1].f <= p1->aCoord[uVar1].f) {
        fVar3 = p2->aCoord[uVar1].f;
      }
      p1->aCoord[uVar1].f = fVar3;
      fVar3 = p1->aCoord[uVar1 + 1].f;
      if (p1->aCoord[uVar1 + 1].f <= p2->aCoord[uVar1 + 1].f) {
        fVar3 = p2->aCoord[uVar1 + 1].f;
      }
      p1->aCoord[uVar1 + 1].f = fVar3;
      uVar1 = uVar1 + 2;
    } while (uVar1 < pRtree->nDim2);
  }
  else {
    uVar1 = 0;
    do {
      iVar2 = p2->aCoord[uVar1].i;
      if (p1->aCoord[uVar1].i < p2->aCoord[uVar1].i) {
        iVar2 = p1->aCoord[uVar1].i;
      }
      p1->aCoord[uVar1].i = iVar2;
      iVar2 = p2->aCoord[uVar1 + 1].i;
      if (p2->aCoord[uVar1 + 1].i < p1->aCoord[uVar1 + 1].i) {
        iVar2 = p1->aCoord[uVar1 + 1].i;
      }
      p1->aCoord[uVar1 + 1].i = iVar2;
      uVar1 = uVar1 + 2;
    } while (uVar1 < pRtree->nDim2);
  }
  return;
}

Assistant:

static void cellUnion(Rtree *pRtree, RtreeCell *p1, RtreeCell *p2){
  int ii = 0;
  if( pRtree->eCoordType==RTREE_COORD_REAL32 ){
    do{
      p1->aCoord[ii].f = MIN(p1->aCoord[ii].f, p2->aCoord[ii].f);
      p1->aCoord[ii+1].f = MAX(p1->aCoord[ii+1].f, p2->aCoord[ii+1].f);
      ii += 2;
    }while( ii<pRtree->nDim2 );
  }else{
    do{
      p1->aCoord[ii].i = MIN(p1->aCoord[ii].i, p2->aCoord[ii].i);
      p1->aCoord[ii+1].i = MAX(p1->aCoord[ii+1].i, p2->aCoord[ii+1].i);
      ii += 2;
    }while( ii<pRtree->nDim2 );
  }
}